

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffibin(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  char local_138 [8];
  char extnm [71];
  char local_e8 [8];
  char errmsg [81];
  LONGLONG newstart;
  LONGLONG datasize;
  long width;
  long repeat;
  long nblocks;
  LONGLONG naxis1;
  int datacode;
  int nhead;
  int nunit;
  int ii;
  int maxhdu;
  int nexthdu;
  char **tunit_local;
  char **tform_local;
  char **ttype_local;
  LONGLONG LStack_20;
  int tfields_local;
  LONGLONG naxis2_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    local_138[0] = '\0';
    _maxhdu = tunit;
    tunit_local = tform;
    tform_local = ttype;
    ttype_local._4_4_ = tfields;
    LStack_20 = naxis2;
    naxis2_local = (LONGLONG)fptr;
    if (extnmx != (char *)0x0) {
      strncat(local_138,extnmx,0x46);
    }
    if (*(int *)naxis2_local != *(int *)(*(long *)(naxis2_local + 8) + 0x54)) {
      ffmahd((fitsfile *)naxis2_local,*(int *)naxis2_local + 1,(int *)0x0,status);
    }
    nunit = *(int *)(*(long *)(naxis2_local + 8) + 0x60);
    if ((*(long *)(*(long *)(naxis2_local + 8) + 0x70) ==
         *(long *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) +
                  (long)*(int *)(*(long *)(naxis2_local + 8) + 0x54) * 8)) ||
       ((*(int *)(*(long *)(naxis2_local + 8) + 0x54) == nunit &&
        (*(long *)(*(long *)(naxis2_local + 8) + 0x30) <=
         *(long *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)(nunit + 1) * 8))))) {
      ffcrtb((fitsfile *)naxis2_local,2,LStack_20,ttype_local._4_4_,tform_local,tunit_local,_maxhdu,
             local_138,status);
      fptr_local._4_4_ = *status;
    }
    else if (LStack_20 < 0) {
      *status = 0xda;
      fptr_local._4_4_ = 0xda;
    }
    else if (((int)ttype_local._4_4_ < 0) || (999 < (int)ttype_local._4_4_)) {
      snprintf(local_e8,0x51,"Illegal value for TFIELDS keyword: %d",(ulong)ttype_local._4_4_);
      ffpmsg(local_e8);
      *status = 0xd8;
      fptr_local._4_4_ = 0xd8;
    }
    else {
      datacode = 0;
      for (nhead = 0; nhead < (int)ttype_local._4_4_; nhead = nhead + 1) {
        if (((_maxhdu != (char **)0x0) && (*_maxhdu != (char *)0x0)) && (*_maxhdu[nhead] != '\0')) {
          datacode = datacode + 1;
        }
      }
      if (local_138[0] != '\0') {
        datacode = datacode + 1;
      }
      naxis1._4_4_ = (int)(ttype_local._4_4_ * 2 + datacode + 0x2c) / 0x24;
      nblocks = 0;
      for (nhead = 0; nhead < (int)ttype_local._4_4_; nhead = nhead + 1) {
        ffbnfm(tunit_local[nhead],(int *)&naxis1,&width,&datasize,status);
        if ((int)naxis1 == 1) {
          lVar2 = (width + 7) / 8;
        }
        else {
          lVar2 = width;
          if ((int)naxis1 != 0x10) {
            lVar2 = width * datasize;
          }
        }
        nblocks = nblocks + lVar2;
      }
      repeat = (nblocks * LStack_20 + pcount + 0xb3f) / 0xb40 + (long)naxis1._4_4_;
      if (*(int *)(*(long *)(naxis2_local + 8) + 0x5c) == 1) {
        ffrdef((fitsfile *)naxis2_local,status);
        ffpdfl((fitsfile *)naxis2_local,status);
        ii = *(int *)(*(long *)(naxis2_local + 8) + 0x54) + 1;
        uVar1 = *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)ii * 8);
        *(undefined4 *)(*(long *)(naxis2_local + 8) + 0x58) = 2;
        iVar3 = ffiblk((fitsfile *)naxis2_local,repeat,1,status);
        if (iVar3 < 1) {
          *(int *)(*(long *)(naxis2_local + 8) + 0x60) =
               *(int *)(*(long *)(naxis2_local + 8) + 0x60) + 1;
          for (nhead = *(int *)(*(long *)(naxis2_local + 8) + 0x60);
              *(int *)(*(long *)(naxis2_local + 8) + 0x54) < nhead; nhead = nhead + -1) {
            *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)(nhead + 1) * 8) =
                 *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)nhead * 8);
          }
          *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)ii * 8) = uVar1;
          *(int *)(*(long *)(naxis2_local + 8) + 0x54) = ii;
          *(int *)naxis2_local = ii;
          *(undefined8 *)(*(long *)(naxis2_local + 8) + 0x80) =
               *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)ii * 8);
          *(undefined8 *)(*(long *)(naxis2_local + 8) + 0x70) =
               *(undefined8 *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)ii * 8);
          *(long *)(*(long *)(naxis2_local + 8) + 0x88) =
               *(long *)(*(long *)(*(long *)(naxis2_local + 8) + 0x68) + (long)ii * 8) +
               (long)(naxis1._4_4_ * 0xb40);
          *(undefined4 *)(*(long *)(naxis2_local + 8) + 0x58) = 2;
          ffphbn((fitsfile *)naxis2_local,LStack_20,ttype_local._4_4_,tform_local,tunit_local,
                 _maxhdu,local_138,pcount,status);
          ffrdef((fitsfile *)naxis2_local,status);
          fptr_local._4_4_ = *status;
        }
        else {
          fptr_local._4_4_ = *status;
        }
      }
      else {
        *status = 0x70;
        fptr_local._4_4_ = 0x70;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffibin(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,     /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount, /* I - size of special data area (heap)         */
           int *status)     /* IO - error status                            */
/*
  insert a Binary table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, datacode;
    LONGLONG naxis1;
    long nblocks, repeat, width;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, BINARY_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    nhead = (9 + (2 * tfields) + nunit + 35) / 36;  /* no. of header blocks */

    /* calculate total width of the table */
    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        ffbnfm(tform[ii], &datacode, &repeat, &width, status);

        if (datacode == TBIT)
            naxis1 = naxis1 + ((repeat + 7) / 8);
        else if (datacode == TSTRING)
            naxis1 += repeat;
        else
            naxis1 = naxis1 + (repeat * width);
    }

    datasize = ((LONGLONG)naxis1 * naxis2) + pcount;         /* size of table in bytes */
    nblocks = (long) ((datasize + 2879) / 2880) + nhead;  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* so that correct fill value is used */

    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
        return(*status);

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = BINARY_TBL;  /* might need to be reset... */

    /* write the required header keywords. This will write PCOUNT = 0 */
    /* so that the variable length data will be written at the right place */
    ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, pcount,
           status);

    /* redefine internal structure for this HDU (with PCOUNT = 0) */
    ffrdef(fptr, status);

    return(*status);
}